

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O1

void Abc_SclTimePerformInt
               (SC_Lib *pLib,Abc_Ntk_t *pNtk,int nTreeCRatio,int fUseWireLoads,int fShowAll,
               int fPrintPath,int fDumpStats)

{
  int iVar1;
  SC_Man *p;
  FILE *__stream;
  char *pcVar2;
  long lVar3;
  timespec local_30;
  
  p = Abc_SclManStart(pLib,pNtk,fUseWireLoads,1,0.0,nTreeCRatio);
  Abc_SclTimeNtkPrint(p,fShowAll,fPrintPath);
  if (fDumpStats != 0) {
    __stream = fopen("stats.txt","a+");
    pcVar2 = p->pNtk->pName;
    iVar1 = strcmp(Abc_SclDumpStats_FileNameOld,pcVar2);
    if (iVar1 == 0) {
      fputc(0x20,__stream);
      fprintf(__stream,"%.1f ",
              ((double)p->pNtk->nObjCounts[7] * 100.0) / (double)Abc_SclDumpStats_nNodesOld);
      fprintf(__stream,"%.1f ",((double)(int)p->SumArea * 100.0) / (double)Abc_SclDumpStats_nAreaOld
             );
      fprintf(__stream,"%.1f ",
              ((double)(int)p->ReportDelay * 100.0) / (double)Abc_SclDumpStats_nDelayOld);
      iVar1 = clock_gettime(3,&local_30);
      if (iVar1 < 0) {
        lVar3 = -1;
      }
      else {
        lVar3 = local_30.tv_nsec / 1000 + local_30.tv_sec * 1000000;
      }
      fprintf(__stream,"%.2f",(double)(lVar3 - Abc_SclDumpStats_clk) / 1000000.0);
    }
    else {
      strcpy(Abc_SclDumpStats_FileNameOld,pcVar2);
      fputc(10,__stream);
      pcVar2 = Extra_FileNameWithoutPath(p->pNtk->pName);
      fprintf(__stream,"%s ",pcVar2);
      fprintf(__stream,"%d ",(ulong)(uint)p->pNtk->vPis->nSize);
      fprintf(__stream,"%d ",(ulong)(uint)p->pNtk->vPos->nSize);
      Abc_SclDumpStats_nNodesOld = p->pNtk->nObjCounts[7];
      fprintf(__stream,"%d ");
      Abc_SclDumpStats_nAreaOld = (int)p->SumArea;
      fprintf(__stream,"%d ");
      Abc_SclDumpStats_nDelayOld = (int)p->ReportDelay;
      fprintf(__stream,"%d ");
      iVar1 = clock_gettime(3,&local_30);
      if (iVar1 < 0) {
        Abc_SclDumpStats_clk = -1;
      }
      else {
        Abc_SclDumpStats_clk = local_30.tv_nsec / 1000 + local_30.tv_sec * 1000000;
      }
    }
    fclose(__stream);
  }
  Abc_SclManFree(p);
  return;
}

Assistant:

void Abc_SclTimePerformInt( SC_Lib * pLib, Abc_Ntk_t * pNtk, int nTreeCRatio, int fUseWireLoads, int fShowAll, int fPrintPath, int fDumpStats )
{
    SC_Man * p;
    p = Abc_SclManStart( pLib, pNtk, fUseWireLoads, 1, 0, nTreeCRatio );
    Abc_SclTimeNtkPrint( p, fShowAll, fPrintPath );
    if ( fDumpStats )
        Abc_SclDumpStats( p, "stats.txt", 0 );
    Abc_SclManFree( p );
}